

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

unit units::root(unit *un,int power)

{
  double dVar1;
  unit_data uVar2;
  ulong uVar3;
  ulong uVar4;
  unit_data local_14;
  
  uVar3 = 0x3f800000;
  if (power == 0) {
    uVar4 = 0;
  }
  else if (((power & 1U) != 0) || (0.0 <= un->multiplier_)) {
    dVar1 = numericalRoot<double>((double)un->multiplier_,power);
    local_14 = un->base_units_;
    uVar2 = detail::unit_data::root(&local_14,power);
    uVar3 = (ulong)(uint)(float)dVar1;
    uVar4 = (ulong)(uint)uVar2 << 0x20;
  }
  else {
    uVar4 = 0xfa94a48800000000;
  }
  return (unit)(uVar3 | uVar4);
}

Assistant:

unit root(const unit& un, int power)
{
    if (power == 0) {
        return one;
    }
    if (un.multiplier() < 0.0 && power % 2 == 0) {
        return error;
    }
    return unit{
        numericalRoot(un.multiplier(), power), un.base_units().root(power)};
}